

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NonAnsiUdpPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NonAnsiUdpPortListSyntax,slang::syntax::NonAnsiUdpPortListSyntax_const&>
          (BumpAllocator *this,NonAnsiUdpPortListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  NonAnsiUdpPortListSyntax *pNVar13;
  
  pNVar13 = (NonAnsiUdpPortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NonAnsiUdpPortListSyntax *)this->endPtr < pNVar13 + 1) {
    pNVar13 = (NonAnsiUdpPortListSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pNVar13 + 1);
  }
  (pNVar13->super_UdpPortListSyntax).super_SyntaxNode.previewNode =
       (args->super_UdpPortListSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_UdpPortListSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_UdpPortListSyntax).super_SyntaxNode.parent;
  (pNVar13->super_UdpPortListSyntax).super_SyntaxNode.kind =
       (args->super_UdpPortListSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar13->super_UdpPortListSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pNVar13->super_UdpPortListSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = (args->openParen).field_0x2;
  NVar7.raw = (args->openParen).numFlags.raw;
  uVar8 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pNVar13->openParen).kind = (args->openParen).kind;
  (pNVar13->openParen).field_0x2 = uVar6;
  (pNVar13->openParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pNVar13->openParen).rawLen = uVar8;
  (pNVar13->openParen).info = pIVar2;
  (pNVar13->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->ports).super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar13->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar13->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pNVar13->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar13->ports).super_SyntaxListBase.childCount = (args->ports).super_SyntaxListBase.childCount;
  (pNVar13->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cbb18;
  sVar3 = (args->ports).elements._M_extent._M_extent_value;
  (pNVar13->ports).elements._M_ptr = (args->ports).elements._M_ptr;
  (pNVar13->ports).elements._M_extent._M_extent_value = sVar3;
  uVar6 = (args->closeParen).field_0x2;
  NVar7.raw = (args->closeParen).numFlags.raw;
  uVar8 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  TVar9 = (args->semi).kind;
  uVar10 = (args->semi).field_0x2;
  NVar11.raw = (args->semi).numFlags.raw;
  uVar12 = (args->semi).rawLen;
  pIVar4 = (args->semi).info;
  (pNVar13->closeParen).kind = (args->closeParen).kind;
  (pNVar13->closeParen).field_0x2 = uVar6;
  (pNVar13->closeParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pNVar13->closeParen).rawLen = uVar8;
  (pNVar13->closeParen).info = pIVar2;
  (pNVar13->semi).kind = TVar9;
  (pNVar13->semi).field_0x2 = uVar10;
  (pNVar13->semi).numFlags = (NumericTokenFlags)NVar11.raw;
  (pNVar13->semi).rawLen = uVar12;
  (pNVar13->semi).info = pIVar4;
  return pNVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }